

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

void hdr_iter_percentile_init(hdr_iter *iter,hdr_histogram *h,int32_t ticks_per_half_distance)

{
  iter->h = h;
  iter->counts_index = -1;
  iter->total_count = h->total_count;
  iter->count = 0;
  iter->cumulative_count = 0;
  iter->value = 0;
  iter->highest_equivalent_value = 0;
  iter->value_iterated_from = 0;
  iter->value_iterated_to = 0;
  (iter->specifics).percentiles.seen_last_value = false;
  (iter->specifics).percentiles.ticks_per_half_distance = ticks_per_half_distance;
  (iter->specifics).percentiles.percentile_to_iterate_to = 0.0;
  (iter->specifics).percentiles.percentile = 0.0;
  iter->_next_fp = percentile_iter_next;
  return;
}

Assistant:

void hdr_iter_init(struct hdr_iter* iter, const struct hdr_histogram* h)
{
    iter->h = h;

    iter->counts_index = -1;
    iter->total_count = h->total_count;
    iter->count = 0;
    iter->cumulative_count = 0;
    iter->value = 0;
    iter->highest_equivalent_value = 0;
    iter->value_iterated_from = 0;
    iter->value_iterated_to = 0;

    iter->_next_fp = all_values_iter_next;
}